

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O2

void __thiscall google::protobuf::io::Printer::WriteRaw(Printer *this,char *data,size_t size)

{
  undefined8 uVar1;
  char cVar2;
  pointer puVar3;
  pointer puVar4;
  size_t sVar5;
  pointer pbVar6;
  undefined8 in_RAX;
  unsigned_long uVar7;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_std::pair<unsigned_long,_unsigned_long>_>_>
  ppVar8;
  size_t i;
  size_t sVar9;
  string *var;
  pointer key;
  undefined1 auVar10 [16];
  undefined7 uStack_38;
  char c;
  
  if ((size != 0) && (this->failed_ == false)) {
    _uStack_38 = in_RAX;
    if ((this->at_start_of_line_ == true) && (*data != '\n')) {
      IndentIfAtStart(this);
      if (this->failed_ != false) {
        return;
      }
      pbVar6 = (this->line_start_variables_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (key = (this->line_start_variables_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; key != pbVar6; key = key + 1) {
        ppVar8 = absl::lts_20250127::container_internal::
                 raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                 ::
                 operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>>
                           ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                             *)&this->substitutions_,key);
        uVar1 = this->indent_;
        auVar10._8_4_ = (int)uVar1;
        auVar10._0_8_ = uVar1;
        auVar10._12_4_ = (int)((ulong)uVar1 >> 0x20);
        ppVar8->first = uVar1 + ppVar8->first;
        ppVar8->second = auVar10._8_8_ + ppVar8->second;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->line_start_variables_);
    if ((this->paren_depth_to_omit_).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->paren_depth_to_omit_).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      zc_sink_internal::ZeroCopyStreamByteSink::Append(&this->sink_,data,size);
    }
    else {
      for (sVar9 = 0; size != sVar9; sVar9 = sVar9 + 1) {
        cVar2 = data[sVar9];
        _uStack_38 = CONCAT17(cVar2,uStack_38);
        if (cVar2 == ')') {
          sVar5 = this->paren_depth_;
          puVar3 = (this->paren_depth_to_omit_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (((this->paren_depth_to_omit_).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start == puVar3) || (puVar3[-1] != sVar5)) {
            this->paren_depth_ = sVar5 - 1;
            goto LAB_00388aa3;
          }
          (this->paren_depth_to_omit_).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar3 + -1;
          this->paren_depth_ = sVar5 - 1;
        }
        else {
          if (cVar2 == '(') {
            puVar3 = (this->paren_depth_to_omit_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar7 = this->paren_depth_ + 1;
            this->paren_depth_ = uVar7;
            puVar4 = (this->paren_depth_to_omit_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if ((puVar3 != puVar4) && (puVar4[-1] == uVar7)) goto LAB_00388ab1;
          }
LAB_00388aa3:
          zc_sink_internal::ZeroCopyStreamByteSink::Append(&this->sink_,&c,1);
        }
LAB_00388ab1:
      }
    }
    this->failed_ = (bool)(this->failed_ | (this->sink_).failed_);
  }
  return;
}

Assistant:

void Printer::WriteRaw(const char* data, size_t size) {
  if (failed_ || size == 0) {
    return;
  }

  if (at_start_of_line_ && data[0] != '\n') {
    IndentIfAtStart();
    if (failed_) {
      return;
    }

    // Fix up empty variables (e.g., "{") that should be annotated as
    // coming after the indent.
    for (const std::string& var : line_start_variables_) {
      auto& pair = substitutions_[var];
      pair.first += indent_;
      pair.second += indent_;
    }
  }

  // If we're going to write any data, clear line_start_variables_, since
  // we've either updated them in the block above or they no longer refer to
  // the current line.
  line_start_variables_.clear();

  if (paren_depth_to_omit_.empty()) {
    sink_.Append(data, size);
  } else {
    for (size_t i = 0; i < size; ++i) {
      char c = data[i];
      switch (c) {
        case '(':
          paren_depth_++;
          if (!paren_depth_to_omit_.empty() &&
              paren_depth_to_omit_.back() == paren_depth_) {
            break;
          }

          sink_.Append(&c, 1);
          break;
        case ')':
          if (!paren_depth_to_omit_.empty() &&
              paren_depth_to_omit_.back() == paren_depth_) {
            paren_depth_to_omit_.pop_back();
            paren_depth_--;
            break;
          }

          paren_depth_--;
          sink_.Append(&c, 1);
          break;
        default:
          sink_.Append(&c, 1);
          break;
      }
    }
  }
  failed_ |= sink_.failed();
}